

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pub.cpp
# Opt level: O2

void __thiscall
so_5::disp::mpsc_queue_traits::impl::combined_lock_t::wait_for_notify(combined_lock_t *this)

{
  default_spinlock_t *this_00;
  long lVar1;
  long lVar2;
  long lVar3;
  unique_lock<std::mutex> mlock;
  unique_lock<std::mutex> uStack_28;
  
  this->m_waiting = true;
  lVar2 = std::chrono::_V2::system_clock::now();
  lVar1 = (this->m_waiting_time).__r;
  this_00 = &this->m_spinlock;
  do {
    (this_00->m_flag).super___atomic_flag_base._M_i = false;
    sched_yield();
    spinlock_t<so_5::yield_backoff_t>::lock(this_00);
    if (this->m_signaled == true) {
      this->m_waiting = false;
      this->m_signaled = false;
      return;
    }
    lVar3 = std::chrono::_V2::system_clock::now();
  } while (lVar3 < lVar2 + lVar1);
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->m_mutex);
  (this->m_spinlock).m_flag.super___atomic_flag_base._M_i = false;
  std::condition_variable::
  wait<so_5::disp::mpsc_queue_traits::impl::combined_lock_t::wait_for_notify()::_lambda()_1_>
            (&this->m_condition,&uStack_28,(anon_class_8_1_8991fb9c)this);
  spinlock_t<so_5::yield_backoff_t>::lock(this_00);
  this->m_waiting = false;
  this->m_signaled = false;
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return;
}

Assistant:

SO_5_NOEXCEPT override
			{
				using clock = std::chrono::high_resolution_clock;

				m_waiting = true;
				auto stop_point = clock::now() + m_waiting_time;

				do
					{
						m_spinlock.unlock();

						std::this_thread::yield();

						m_spinlock.lock();

						if( m_signaled )
							{
								m_waiting = false;
								m_signaled = false;
								return;
							}
					}
				while( stop_point > clock::now() );

				// m_lock is locked now.

				// Must use heavy std::mutex and std::condition_variable
				// to allow OS to efficiently use the resources while
				// we are waiting for signal.
				std::unique_lock< std::mutex > mlock( m_mutex );

				m_spinlock.unlock();

				m_condition.wait( mlock, [this]{ return m_signaled; } );

				// At this point m_signaled must be 'true'.

				m_spinlock.lock();

				m_waiting = false;
				m_signaled = false;
			}